

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O1

bool __thiscall re2c::Spec::add_def(Spec *this,RuleOp *r)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  RegExp *pRVar5;
  RegExp *e2;
  key_type local_34;
  
  rule_rank_t::def();
  iVar3 = std::
          _Rb_tree<re2c::rule_rank_t,_std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>,_std::_Select1st<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
          ::find(&(this->rules)._M_t,&local_34);
  p_Var1 = &(this->rules)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
    uVar2 = (r->loc).line;
    pmVar4 = std::
             map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
             ::operator[](&this->rules,&r->rank);
    pmVar4->line = uVar2;
    pRVar5 = mkAlt((re2c *)this->re,&r->super_RegExp,e2);
    this->re = pRVar5;
  }
  return (_Rb_tree_header *)iVar3._M_node == p_Var1;
}

Assistant:

bool add_def (RuleOp * r)
	{
		if (rules.find (rule_rank_t::def ()) != rules.end ())
		{
			return false;
		}
		else
		{
			add (r);
			return true;
		}
	}